

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

size_t ra_portable_serialize(roaring_array_t *ra,char *buf)

{
  byte *pbVar1;
  uint uVar2;
  ulong uVar3;
  _Bool _Var4;
  int iVar5;
  int32_t iVar6;
  void *__src;
  ulong uVar7;
  run_container_t *container;
  uint8_t uVar8;
  int32_t k;
  ulong uVar9;
  long lVar10;
  ulong __nmemb;
  int iVar11;
  uint16_t *buf_00;
  uint8_t local_39;
  char *local_38;
  
  _Var4 = ra_has_run_container(ra);
  local_38 = buf;
  if (_Var4) {
    *(int32_t *)buf = ra->size * 0x10000 + -0xcfc5;
    uVar2 = ra->size;
    uVar3 = (long)(int)(uVar2 + 7) / 8;
    __nmemb = uVar3 & 0xffffffff;
    __src = calloc(__nmemb,1);
    if (__src == (void *)0x0) {
      __assert_fail("bitmapOfRunContainers != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x486f,"size_t ra_portable_serialize(const roaring_array_t *, char *)");
    }
    uVar7 = 0;
    uVar9 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar9 = uVar7;
    }
    for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      uVar8 = ra->typecodes[uVar7];
      if (uVar8 == '\x04') {
        uVar8 = *(uint8_t *)((long)ra->containers[uVar7] + 8);
      }
      if (uVar8 == '\x03') {
        pbVar1 = (byte *)((long)__src + (uVar7 >> 3 & 0x1fffffff));
        *pbVar1 = *pbVar1 | '\x01' << ((byte)uVar7 & 7);
      }
    }
    memcpy(buf + 4,__src,__nmemb);
    buf_00 = (uint16_t *)(buf + 4 + __nmemb);
    free(__src);
    iVar5 = ra->size;
    iVar11 = iVar5 * 8;
    if (iVar5 < 4) {
      iVar11 = iVar5 * 4;
    }
    iVar11 = iVar11 + 4 + (int)uVar3;
  }
  else {
    buf[0] = ':';
    buf[1] = '0';
    buf[2] = '\0';
    buf[3] = '\0';
    *(int32_t *)(buf + 4) = ra->size;
    buf_00 = (uint16_t *)(buf + 8);
    iVar5 = ra->size;
    iVar11 = iVar5 * 8 + 8;
  }
  for (lVar10 = 0; lVar10 < iVar5; lVar10 = lVar10 + 1) {
    *buf_00 = ra->keys[lVar10];
    iVar5 = container_get_cardinality(ra->containers[lVar10],ra->typecodes[lVar10]);
    buf_00[1] = (short)iVar5 - 1;
    buf_00 = buf_00 + 2;
    iVar5 = ra->size;
  }
  if (!_Var4 || 3 < iVar5) {
    for (lVar10 = 0; lVar10 < iVar5; lVar10 = lVar10 + 1) {
      *(int *)buf_00 = iVar11;
      buf_00 = buf_00 + 2;
      iVar6 = container_size_in_bytes(ra->containers[lVar10],ra->typecodes[lVar10]);
      iVar11 = iVar11 + iVar6;
      iVar5 = ra->size;
    }
  }
  lVar10 = 0;
  do {
    if (iVar5 <= lVar10) {
      return (long)buf_00 - (long)local_38;
    }
    local_39 = ra->typecodes[lVar10];
    container = (run_container_t *)container_unwrap_shared(ra->containers[lVar10],&local_39);
    if (local_39 == '\x03') {
      iVar11 = run_container_write(container,(char *)buf_00);
    }
    else if (local_39 == '\x02') {
      memcpy(buf_00,container->runs,(long)container->n_runs * 2);
      iVar11 = container->n_runs * 2;
    }
    else {
      if (local_39 != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x118f,"int32_t container_write(const container_t *, uint8_t, char *)");
      }
      memcpy(buf_00,container->runs,0x2000);
      iVar11 = 0x2000;
    }
    buf_00 = (uint16_t *)((long)buf_00 + (long)iVar11);
    lVar10 = lVar10 + 1;
    iVar5 = ra->size;
  } while( true );
}

Assistant:

size_t ra_portable_serialize(const roaring_array_t *ra, char *buf) {
    char *initbuf = buf;
    uint32_t startOffset = 0;
    bool hasrun = ra_has_run_container(ra);
    if (hasrun) {
        uint32_t cookie = SERIAL_COOKIE | ((ra->size - 1) << 16);
        memcpy(buf, &cookie, sizeof(cookie));
        buf += sizeof(cookie);
        uint32_t s = (ra->size + 7) / 8;
        uint8_t *bitmapOfRunContainers = (uint8_t *)calloc(s, 1);
        assert(bitmapOfRunContainers != NULL);  // todo: handle
        for (int32_t i = 0; i < ra->size; ++i) {
            if (get_container_type(ra->containers[i], ra->typecodes[i]) ==
                RUN_CONTAINER_TYPE) {
                bitmapOfRunContainers[i / 8] |= (1 << (i % 8));
            }
        }
        memcpy(buf, bitmapOfRunContainers, s);
        buf += s;
        free(bitmapOfRunContainers);
        if (ra->size < NO_OFFSET_THRESHOLD) {
            startOffset = 4 + 4 * ra->size + s;
        } else {
            startOffset = 4 + 8 * ra->size + s;
        }
    } else {  // backwards compatibility
        uint32_t cookie = SERIAL_COOKIE_NO_RUNCONTAINER;

        memcpy(buf, &cookie, sizeof(cookie));
        buf += sizeof(cookie);
        memcpy(buf, &ra->size, sizeof(ra->size));
        buf += sizeof(ra->size);

        startOffset = 4 + 4 + 4 * ra->size + 4 * ra->size;
    }
    for (int32_t k = 0; k < ra->size; ++k) {
        memcpy(buf, &ra->keys[k], sizeof(ra->keys[k]));
        buf += sizeof(ra->keys[k]);
        // get_cardinality returns a value in [1,1<<16], subtracting one
        // we get [0,1<<16 - 1] which fits in 16 bits
        uint16_t card = (uint16_t)(
            container_get_cardinality(ra->containers[k], ra->typecodes[k]) - 1);
        memcpy(buf, &card, sizeof(card));
        buf += sizeof(card);
    }
    if ((!hasrun) || (ra->size >= NO_OFFSET_THRESHOLD)) {
        // writing the containers offsets
        for (int32_t k = 0; k < ra->size; k++) {
            memcpy(buf, &startOffset, sizeof(startOffset));
            buf += sizeof(startOffset);
            startOffset =
                startOffset +
                container_size_in_bytes(ra->containers[k], ra->typecodes[k]);
        }
    }
    for (int32_t k = 0; k < ra->size; ++k) {
        buf += container_write(ra->containers[k], ra->typecodes[k], buf);
    }
    return buf - initbuf;
}